

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

void nullcPrintComplexVariableInfo(ExternTypeInfo *type,char *ptr,uint indentDepth)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  ExternTypeInfo *pEVar4;
  ExternMemberInfo *pEVar5;
  size_t sVar6;
  ExternTypeInfo *type_00;
  uint localOffset;
  ExternTypeInfo *memberType;
  char *pcStack_40;
  uint i;
  char *memberName;
  ExternMemberInfo *codeTypeExtra;
  ExternTypeInfo *codeTypes;
  char *codeSymbols;
  uint indentDepth_local;
  char *ptr_local;
  ExternTypeInfo *type_local;
  
  pcVar3 = nullcDebugSymbols((uint *)0x0);
  pEVar4 = nullcDebugTypeInfo((uint *)0x0);
  pEVar5 = nullcDebugTypeExtraInfo((uint *)0x0);
  uVar1 = type->offsetToName;
  sVar6 = strlen(pcVar3 + type->offsetToName);
  pcStack_40 = pcVar3 + (sVar6 & 0xffffffff) + (ulong)uVar1 + 1;
  for (memberType._4_4_ = 0; memberType._4_4_ < (type->field_8).arrSize;
      memberType._4_4_ = memberType._4_4_ + 1) {
    type_00 = pEVar4 + pEVar5[(type->field_11).subType + memberType._4_4_].type;
    uVar1 = pEVar5[(type->field_11).subType + memberType._4_4_].offset;
    nullcPrintDepthIndent(indentDepth);
    printf("%s %s",pcVar3 + type_00->offsetToName,pcStack_40);
    if ((type_00->subCat == CAT_NONE) || (type_00->subCat == CAT_POINTER)) {
      printf(" = ");
      nullcPrintBasicVariableInfo(type_00,ptr + uVar1);
      printf("\n");
    }
    else {
      iVar2 = strcmp(pcVar3 + type_00->offsetToName,"typeid");
      if (iVar2 == 0) {
        printf(" = %s\n",pcVar3 + pEVar4[*(int *)(ptr + uVar1)].offsetToName);
      }
      else {
        printf("\n");
        nullcPrintVariableInfo(type_00,ptr + uVar1,indentDepth + 1);
      }
    }
    sVar6 = strlen(pcStack_40);
    pcStack_40 = pcStack_40 + ((int)sVar6 + 1);
  }
  return;
}

Assistant:

void nullcPrintComplexVariableInfo(const ExternTypeInfo& type, char* ptr, unsigned indentDepth)
{
	char *codeSymbols = nullcDebugSymbols(NULL);
	ExternTypeInfo *codeTypes = nullcDebugTypeInfo(NULL);
	ExternMemberInfo *codeTypeExtra = nullcDebugTypeExtraInfo(NULL);

	const char *memberName = codeSymbols + type.offsetToName + (unsigned)strlen(codeSymbols + type.offsetToName) + 1;

	for(unsigned i = 0; i < type.memberCount; i++)
	{
		ExternTypeInfo &memberType = codeTypes[codeTypeExtra[type.memberOffset + i].type];

		unsigned localOffset = codeTypeExtra[type.memberOffset + i].offset;

		nullcPrintDepthIndent(indentDepth);
		printf("%s %s", codeSymbols + memberType.offsetToName, memberName);

		if(memberType.subCat == ExternTypeInfo::CAT_NONE || memberType.subCat == ExternTypeInfo::CAT_POINTER)
		{
			printf(" = ");
			nullcPrintBasicVariableInfo(memberType, ptr + localOffset);
			printf("\n");
		}
		else if(strcmp(codeSymbols + memberType.offsetToName, "typeid") == 0)
		{
			printf(" = %s\n", codeSymbols + codeTypes[*(int*)(ptr + localOffset)].offsetToName);
		}
		else
		{
			printf("\n");
			nullcPrintVariableInfo(memberType, ptr + localOffset, indentDepth + 1);
		}

		memberName += (unsigned)strlen(memberName) + 1;
	}
}